

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

int __thiscall Map_Chest::AddItem(Map_Chest *this,short item_id,int amount,int slot)

{
  bool bVar1;
  size_type sVar2;
  reference pMVar3;
  undefined1 local_80 [8];
  Map_Chest_Item chestitem;
  Map_Chest_Item item_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *__range2_1;
  int user_items;
  Map_Chest_Item *item;
  iterator __end2;
  iterator __begin2;
  list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *__range2;
  int slot_local;
  int amount_local;
  short item_id_local;
  Map_Chest *this_local;
  
  if (amount < 1) {
    this_local._4_4_ = 0;
  }
  else {
    if (slot == 0) {
      __end2 = std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::begin
                         (&this->items);
      item = (Map_Chest_Item *)
             std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::end(&this->items);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&item), bVar1) {
        pMVar3 = std::_List_iterator<Map_Chest_Item>::operator*(&__end2);
        if (pMVar3->id == item_id) {
          if ((-1 < pMVar3->amount + amount) && (pMVar3->amount + amount <= this->maxchest)) {
            pMVar3->amount = amount + pMVar3->amount;
            return amount;
          }
          return 0;
        }
        std::_List_iterator<Map_Chest_Item>::operator++(&__end2);
      }
    }
    sVar2 = std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::size(&this->items);
    if ((sVar2 < (ulong)(long)this->chestslots) && (amount <= this->maxchest)) {
      if (slot == 0) {
        __range2_1._4_4_ = 0;
        __end2_1 = std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::begin
                             (&this->items);
        item_1._4_8_ = std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::end
                                 (&this->items);
        while (bVar1 = std::operator!=(&__end2_1,(_Self *)&item_1.amount), bVar1) {
          pMVar3 = std::_List_iterator<Map_Chest_Item>::operator*(&__end2_1);
          chestitem._4_8_ = *(undefined8 *)pMVar3;
          item_1._0_4_ = pMVar3->slot;
          if (item_1._0_4_ == 0) {
            __range2_1._4_4_ = __range2_1._4_4_ + 1;
          }
          std::_List_iterator<Map_Chest_Item>::operator++(&__end2_1);
        }
        if (this->chestslots <= __range2_1._4_4_ + this->slots) {
          return 0;
        }
      }
      local_80._0_2_ = item_id;
      local_80._4_4_ = amount;
      chestitem._0_4_ = slot;
      this_local._4_4_ = amount;
      if (slot == 0) {
        std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::push_back
                  (&this->items,(value_type *)local_80);
      }
      else {
        std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::push_front
                  (&this->items,(value_type *)local_80);
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Map_Chest::AddItem(short item_id, int amount, int slot)
{
	if (amount <= 0)
	{
		return 0;
	}

	if (slot == 0)
	{
		UTIL_FOREACH_REF(this->items, item)
		{
			if (item.id == item_id)
			{
				if (item.amount + amount < 0 || item.amount + amount > this->maxchest)
				{
					return 0;
				}

				item.amount += amount;
				return amount;
			}
		}
	}

	if (this->items.size() >= static_cast<std::size_t>(this->chestslots) || amount > this->maxchest)
	{
		return 0;
	}

	if (slot == 0)
	{
		int user_items = 0;

		UTIL_FOREACH(this->items, item)
		{
			if (item.slot == 0)
			{
				++user_items;
			}
		}

		if (user_items + this->slots >= this->chestslots)
		{
			return 0;
		}
	}

	Map_Chest_Item chestitem;
	chestitem.id = item_id;
	chestitem.amount = amount;
	chestitem.slot = slot;

	if (slot == 0)
	{
		this->items.push_back(chestitem);
	}
	else
	{
		this->items.push_front(chestitem);
	}

	return amount;
}